

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O1

void __thiscall
NfcFilter::process1(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  pfVar4 = src.mData;
  fVar5 = (this->first).z[0];
  if (pfVar4 != src.mDataEnd) {
    fVar1 = (this->first).gain;
    fVar2 = (this->first).b1;
    fVar3 = (this->first).a1;
    do {
      fVar7 = *pfVar4 * fVar1 + fVar5 * -fVar3;
      fVar6 = fVar2 * fVar5;
      fVar5 = fVar5 + fVar7;
      *dst = fVar6 + fVar7;
      pfVar4 = pfVar4 + 1;
      dst = dst + 1;
    } while (pfVar4 != src.mDataEnd);
  }
  (this->first).z[0] = fVar5;
  return;
}

Assistant:

void NfcFilter::process1(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{first.gain};
    const float b1{first.b1};
    const float a1{first.a1};
    float z1{first.z[0]};
    auto proc_sample = [gain,b1,a1,&z1](const float in) noexcept -> float
    {
        const float y{in*gain - a1*z1};
        const float out{y + b1*z1};
        z1 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    first.z[0] = z1;
}